

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O2

int __thiscall MatroskaDemuxer::matroska_parse_index(MatroskaDemuxer *this)

{
  int *levelUp;
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  int64_t time;
  MatroskaDemuxIndex idx;
  uint32_t local_34;
  
  idx.time = 0;
  idx.pos = 0;
  idx.track = 0;
  idx._10_6_ = 0;
  levelUp = &this->level_up;
  iVar2 = 0;
  do {
    if (iVar2 != 0) {
      return iVar2;
    }
    uVar1 = ebml_peek_id(this,levelUp);
    if (uVar1 == 0) {
      return -1;
    }
    iVar3 = *levelUp;
    if (iVar3 != 0) {
      iVar2 = 0;
      break;
    }
    if (((uVar1 == 0xec) || (uVar1 == 0xbf)) || (uVar1 != 0xbb)) {
      iVar2 = ebml_read_skip(this);
    }
    else {
      iVar2 = ebml_read_master(this,&local_34);
      if (-1 < iVar2) {
        idx.pos = 0xffffffffffffffff;
        idx.time = 0xffffffffffffffff;
        idx.track = -1;
        iVar2 = 0;
        do {
          if (iVar2 != 0) goto LAB_001aaa1b;
          uVar1 = ebml_peek_id(this,levelUp);
          if (uVar1 == 0) {
            iVar2 = -1;
            goto LAB_001aaa1b;
          }
          iVar3 = *levelUp;
          if (iVar3 != 0) {
            iVar2 = 0;
            break;
          }
          if (uVar1 == 0xec) {
LAB_001aa918:
            iVar2 = ebml_read_skip(this);
LAB_001aa923:
            iVar3 = *levelUp;
          }
          else {
            if (uVar1 != 0xb7) {
              if ((uVar1 == 0xbf) || (uVar1 != 0xb3)) goto LAB_001aa918;
              iVar2 = ebml_read_uint(this,&local_34,&time);
              if (-1 < iVar2) {
                idx.time = this->time_scale * CONCAT62(time._2_6_,(int16_t)time);
              }
              goto LAB_001aa923;
            }
            iVar2 = ebml_read_master(this,&local_34);
            if (iVar2 != 0) goto LAB_001aa923;
            do {
              uVar1 = ebml_peek_id(this,levelUp);
              if (uVar1 == 0) {
                iVar2 = -1;
                goto LAB_001aa923;
              }
              if (*levelUp != 0) {
                iVar3 = *levelUp + -1;
                *levelUp = iVar3;
                iVar2 = 0;
                break;
              }
              if ((uVar1 == 0xbf) || (uVar1 == 0xec)) {
LAB_001aa9bc:
                iVar2 = ebml_read_skip(this);
              }
              else if (uVar1 == 0xf1) {
                iVar2 = ebml_read_uint(this,&local_34,&time);
                if (-1 < iVar2) {
                  idx.pos = this->segment_start + CONCAT62(time._2_6_,(int16_t)time);
                }
              }
              else {
                if (uVar1 != 0xf7) goto LAB_001aa9bc;
                iVar2 = ebml_read_uint(this,&local_34,&time);
                if (-1 < iVar2) {
                  idx.track = (int16_t)time;
                }
              }
              if (*levelUp != 0) {
                iVar3 = *levelUp + -1;
                *levelUp = iVar3;
                break;
              }
              iVar3 = 0;
            } while (iVar2 == 0);
          }
        } while (iVar3 == 0);
        *levelUp = iVar3 + -1;
LAB_001aaa1b:
        if (((idx.pos != 0xffffffffffffffff) && (idx.time != 0xffffffffffffffff)) &&
           (idx.track != -1)) {
          std::
          vector<MatroskaDemuxer::MatroskaDemuxIndex,_std::allocator<MatroskaDemuxer::MatroskaDemuxIndex>_>
          ::push_back(&this->indexes,&idx);
        }
      }
    }
    iVar3 = *levelUp;
  } while (iVar3 == 0);
  *levelUp = iVar3 + -1;
  return iVar2;
}

Assistant:

int MatroskaDemuxer::matroska_parse_index()
{
    int res = 0;
    uint32_t id;
    MatroskaDemuxIndex idx{};

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* one single index entry ('point') */
        case MATROSKA_ID_POINTENTRY:
            if ((res = ebml_read_master(&id)) < 0)
                break;

            /* in the end, we hope to fill one entry with a
             * timestamp, a file position and a tracknum */
            idx.pos = ULLONG_MAX;
            idx.time = ULLONG_MAX;
            idx.track = -1;

            while (res == 0)
            {
                if ((id = ebml_peek_id(&level_up)) == 0)
                {
                    res = -BufferedReader::DATA_EOF;
                    break;
                }
                if (level_up)
                {
                    level_up--;
                    break;
                }

                switch (id)
                {
                /* one single index entry ('point') */
                case MATROSKA_ID_CUETIME:
                {
                    int64_t time;
                    if ((res = ebml_read_uint(&id, &time)) < 0)
                        break;
                    idx.time = time * time_scale;
                    break;
                }

                /* position in the file + track to which it
                 * belongs */
                case MATROSKA_ID_CUETRACKPOSITION:
                    if ((res = ebml_read_master(&id)) < 0)
                        break;

                    while (res == 0)
                    {
                        if ((id = ebml_peek_id(&level_up)) == 0)
                        {
                            res = -BufferedReader::DATA_EOF;
                            break;
                        }
                        if (level_up)
                        {
                            level_up--;
                            break;
                        }

                        switch (id)
                        {
                        /* track number */
                        case MATROSKA_ID_CUETRACK:
                        {
                            int64_t num;
                            if ((res = ebml_read_uint(&id, &num)) < 0)
                                break;
                            idx.track = static_cast<int16_t>(num);
                            break;
                        }

                        /* position in file */
                        case MATROSKA_ID_CUECLUSTERPOSITION:
                        {
                            int64_t num;
                            if ((res = ebml_read_uint(&id, &num)) < 0)
                                break;
                            idx.pos = num + segment_start;
                            break;
                        }
                        case EBML_ID_VOID:
                        case EBML_ID_CRC32:
                            res = ebml_read_skip();
                            break;
                        default:
                            res = ebml_read_skip();
                            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in CuesTrackPositions");
                        }

                        if (level_up)
                        {
                            level_up--;
                            break;
                        }
                    }
                    break;
                case EBML_ID_VOID:
                case EBML_ID_CRC32:
                    res = ebml_read_skip();
                    break;
                default:
                    res = ebml_read_skip();
                    LTRACE(LT_INFO, 0, "Unknown entry " << id << " in cuespoint index");
                }

                if (level_up)
                {
                    level_up--;
                    break;
                }
            }

            /* so let's see if we got what we wanted */
            if (idx.pos != ULLONG_MAX && idx.time != ULLONG_MAX && idx.track != -1)
            {
                indexes.push_back(idx);
            }
            break;
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown entry " << id << " in cues header");
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    return res;
}